

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O3

QItemSelection * __thiscall
QAbstractProxyModel::mapSelectionFromSource
          (QItemSelection *__return_storage_ptr__,QAbstractProxyModel *this,
          QItemSelection *sourceSelection)

{
  undefined1 *puVar1;
  long lVar2;
  long in_FS_OFFSET;
  QItemSelectionRange QStack_88;
  QModelIndex local_78;
  QModelIndexList local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::indexes(&local_58,sourceSelection);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar2 = 0;
    puVar1 = (undefined1 *)0x0;
    do {
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.r = -0x55555556;
      local_78.c = -0x55555556;
      local_78.i._0_4_ = 0xaaaaaaaa;
      local_78.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)this + 0x198))
                (&local_78,this,(undefined1 *)((long)&(local_58.d.ptr)->r + lVar2));
      if (((-1 < local_78.r) && (-1 < local_78.c)) && (local_78.m.ptr != (QAbstractItemModel *)0x0))
      {
        QItemSelectionRange::QItemSelectionRange(&QStack_88,&local_78);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size,&QStack_88);
        QList<QItemSelectionRange>::end(&__return_storage_ptr__->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex(&QStack_88.br);
        QPersistentModelIndex::~QPersistentModelIndex(&QStack_88.tl);
      }
      puVar1 = puVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (puVar1 < (ulong)local_58.d.size);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelection QAbstractProxyModel::mapSelectionFromSource(const QItemSelection &sourceSelection) const
{
    QModelIndexList sourceIndexes = sourceSelection.indexes();
    QItemSelection proxySelection;
    for (int i = 0; i < sourceIndexes.size(); ++i) {
        const QModelIndex srcIdx = mapFromSource(sourceIndexes.at(i));
        if (!srcIdx.isValid())
            continue;
        proxySelection << QItemSelectionRange(srcIdx);
    }
    return proxySelection;
}